

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O2

IterateResult __thiscall glcts::InterfaceMatchingCase::iterate(InterfaceMatchingCase *this)

{
  TestType testType;
  glProgramUniform4fFunc p_Var1;
  RenderContext *pRVar2;
  glUniform4fFunc p_Var3;
  pointer pbVar4;
  int iVar5;
  int iVar6;
  GLuint program;
  GLenum GVar7;
  uint uVar8;
  GLint GVar9;
  GLuint GVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar11;
  TestError *pTVar12;
  ostream *poVar13;
  int height;
  long lVar14;
  char *pcVar15;
  string *psVar16;
  bool bVar17;
  GLuint pipeline;
  pointer local_668;
  GLuint local_660;
  allocator<char> local_65a;
  allocator<char> local_659;
  TestType local_658;
  GLuint indexBuf;
  GLuint vertexBuf;
  GLuint vao;
  char *srcStrings [1];
  GLuint value;
  string *local_638;
  Surface renderedFrame;
  string fragmentPrecision;
  string vertexPrecision;
  string frag;
  string vtx;
  string local_590;
  string local_570;
  Surface local_550;
  Surface local_538;
  ShaderProgram progVF;
  string frag2;
  stringstream str;
  undefined1 local_428 [384];
  float position [16];
  PrecisionTests vertexPrecisionTests [7];
  PrecisionTests fragmentPrecisionTests [7];
  Functions *gl;
  
  local_668 = (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar5);
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  iVar5 = *(int *)CONCAT44(extraout_var_00,iVar6);
  if (0xf < iVar5) {
    iVar5 = 0x10;
  }
  iVar6 = ((int *)CONCAT44(extraout_var_00,iVar6))[1];
  height = 0x10;
  if (iVar6 < 0x10) {
    height = iVar6;
  }
  tcu::Surface::Surface(&renderedFrame,iVar5,height);
  vtx._M_dataplus._M_p = (pointer)&vtx.field_2;
  vtx._M_string_length = 0;
  frag._M_dataplus._M_p = (pointer)&frag.field_2;
  frag._M_string_length = 0;
  vtx.field_2._M_local_buf[0] = '\0';
  frag.field_2._M_local_buf[0] = '\0';
  frag2._M_dataplus._M_p = (pointer)&frag2.field_2;
  frag2._M_string_length = 0;
  frag2.field_2._M_local_buf[0] = '\0';
  (*gl->viewport)(0,0,iVar5,height);
  (*gl->clearColor)(0.0,0.0,0.0,0.0);
  (*gl->clear)(0x4000);
  position[0xc] = 1.0;
  position[0xd] = 1.0;
  position[0xe] = -1.0;
  position[0xf] = 1.0;
  position[8] = 1.0;
  position[9] = -1.0;
  position[10] = 0.0;
  position[0xb] = 1.0;
  position[4] = -1.0;
  position[5] = 1.0;
  position[6] = 0.0;
  position[7] = 1.0;
  position[0] = -1.0;
  position[1] = -1.0;
  position[2] = 1.0;
  position[3] = 1.0;
  (*gl->genVertexArrays)(1,&vao);
  (*gl->bindVertexArray)(vao);
  (*gl->genBuffers)(1,&indexBuf);
  (*gl->bindBuffer)(0x8893,indexBuf);
  (*gl->bufferData)(0x8893,0xc,iterate::quadIndices,0x88e4);
  (*gl->genBuffers)(1,&vertexBuf);
  (*gl->bindBuffer)(0x8892,vertexBuf);
  (*gl->bufferData)(0x8892,0x40,position,0x88e4);
  (*gl->genProgramPipelines)(1,&pipeline);
  (*gl->bindProgramPipeline)(pipeline);
  vertexPrecisionTests[0].testType = DEFAULT_PRECISION;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vertexPrecisionTests[0].precision,"highp",(allocator<char> *)&str);
  vertexPrecisionTests[1].testType = SET_DEFAULT_PRECISION;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vertexPrecisionTests[1].precision,"highp",
             (allocator<char> *)fragmentPrecisionTests);
  vertexPrecisionTests[2].testType = SET_DEFAULT_PRECISION;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vertexPrecisionTests[2].precision,"mediump",(allocator<char> *)&progVF);
  vertexPrecisionTests[3].testType = SET_DEFAULT_PRECISION;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vertexPrecisionTests[3].precision,"lowp",(allocator<char> *)&vertexPrecision
            );
  vertexPrecisionTests[4].testType = SET_PRECISION;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vertexPrecisionTests[4].precision,"highp",
             (allocator<char> *)&fragmentPrecision);
  vertexPrecisionTests[5].testType = SET_PRECISION;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vertexPrecisionTests[5].precision,"mediump",(allocator<char> *)&local_590);
  vertexPrecisionTests[6].testType = SET_PRECISION;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vertexPrecisionTests[6].precision,"lowp",(allocator<char> *)&local_570);
  fragmentPrecisionTests[0].testType = DEFAULT_PRECISION;
  getDefaultFragmentPrecision_abi_cxx11_(&fragmentPrecisionTests[0].precision,this);
  fragmentPrecisionTests[1].testType = SET_DEFAULT_PRECISION;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fragmentPrecisionTests[1].precision,"highp",(allocator<char> *)&str);
  fragmentPrecisionTests[2].testType = SET_DEFAULT_PRECISION;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fragmentPrecisionTests[2].precision,"mediump",(allocator<char> *)&progVF);
  fragmentPrecisionTests[3].testType = SET_DEFAULT_PRECISION;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fragmentPrecisionTests[3].precision,"lowp",
             (allocator<char> *)&vertexPrecision);
  fragmentPrecisionTests[4].testType = SET_PRECISION;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fragmentPrecisionTests[4].precision,"highp",
             (allocator<char> *)&fragmentPrecision);
  fragmentPrecisionTests[5].testType = SET_PRECISION;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fragmentPrecisionTests[5].precision,"mediump",(allocator<char> *)&local_590)
  ;
  fragmentPrecisionTests[6].testType = SET_PRECISION;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fragmentPrecisionTests[6].precision,"lowp",(allocator<char> *)&local_570);
  lVar11 = 0;
  do {
    if (lVar11 == 7) {
      (*gl->bindVertexArray)(0);
      (*gl->deleteVertexArrays)(1,&vao);
      (*gl->deleteBuffers)(1,&indexBuf);
      (*gl->deleteBuffers)(1,&vertexBuf);
      (*gl->bindProgramPipeline)(0);
      (*gl->deleteProgramPipelines)(1,&pipeline);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
      lVar11 = 0xf8;
      do {
        std::__cxx11::string::~string
                  ((string *)((long)&fragmentPrecisionTests[0].testType + lVar11));
        lVar11 = lVar11 + -0x28;
      } while (lVar11 != -0x20);
      lVar11 = 0xf8;
      do {
        std::__cxx11::string::~string((string *)((long)&vertexPrecisionTests[0].testType + lVar11));
        lVar11 = lVar11 + -0x28;
      } while (lVar11 != -0x20);
      std::__cxx11::string::~string((string *)&frag2);
      std::__cxx11::string::~string((string *)&frag);
      std::__cxx11::string::~string((string *)&vtx);
      tcu::Surface::~Surface(&renderedFrame);
      return STOP;
    }
    std::__cxx11::string::string
              ((string *)&vertexPrecision,(string *)&vertexPrecisionTests[lVar11].precision);
    local_658 = vertexPrecisionTests[lVar11].testType;
    psVar16 = (string *)&fragmentPrecisionTests[0].precision;
    lVar14 = 7;
    while (bVar17 = lVar14 != 0, lVar14 = lVar14 + -1, bVar17) {
      local_638 = psVar16;
      std::__cxx11::string::string((string *)&fragmentPrecision,psVar16);
      if (fragmentPrecision._M_string_length != 0) {
        testType = *(TestType *)(local_638 + -8);
        _str = local_668;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_428);
        std::operator<<((ostream *)local_428,"vertex shader precision: ");
        std::operator<<((ostream *)local_428,(string *)&vertexPrecision);
        std::operator<<((ostream *)local_428,", shader test mode: ");
        getTestTypeName_abi_cxx11_((string *)&progVF,this,local_658);
        std::operator<<((ostream *)local_428,(string *)&progVF);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&str,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)&progVF);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_428);
        _str = local_668;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_428);
        std::operator<<((ostream *)local_428,"fragment shader precision: ");
        std::operator<<((ostream *)local_428,(string *)&fragmentPrecision);
        std::operator<<((ostream *)local_428,", shader test mode: ");
        getTestTypeName_abi_cxx11_((string *)&progVF,this,testType);
        std::operator<<((ostream *)local_428,(string *)&progVF);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&str,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)&progVF);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_428);
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
                  (this,&vtx,(ulong)this->m_glslVersion,&vertexPrecision,(ulong)local_658);
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])
                  (this,&frag,(ulong)this->m_glslVersion,&fragmentPrecision);
        srcStrings[0] = vtx._M_dataplus._M_p;
        program = (*gl->createShaderProgramv)(0x8b31,1,srcStrings);
        bVar17 = checkCSProg(this,gl,program,1);
        if (!bVar17) {
          pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar12,"CreateShaderProgramv failed for vertex shader",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                     ,0xaac);
LAB_00c037b4:
          __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        srcStrings[0] = frag._M_dataplus._M_p;
        local_660 = (*gl->createShaderProgramv)(0x8b30,1,srcStrings);
        bVar17 = checkCSProg(this,gl,local_660,1);
        if (!bVar17) {
          pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar12,"CreateShaderProgramv failed for fragment shader",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                     ,0xab2);
          goto LAB_00c037b4;
        }
        (*gl->useProgramStages)(pipeline,1,program);
        (*gl->useProgramStages)(pipeline,2,local_660);
        GVar7 = (*gl->getError)();
        glu::checkError(GVar7,"InterfaceMatching failure",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                        ,0xab7);
        (*gl->validateProgramPipeline)(pipeline);
        (*gl->getProgramPipelineiv)(pipeline,0x8b83,(GLint *)&value);
        iVar5 = std::__cxx11::string::compare((string *)&fragmentPrecision);
        uVar8 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
        pbVar4 = local_668;
        if ((iVar5 == 0) || ((uVar8 & 0x300) != 0)) {
          if (value != 1) {
            std::__cxx11::stringstream::stringstream((stringstream *)&str);
            poVar13 = std::operator<<((ostream *)(local_428 + 8),"Precision ");
            pcVar15 = "matches";
            if (iVar5 != 0) {
              pcVar15 = "mismatch";
            }
            poVar13 = std::operator<<(poVar13,pcVar15);
            std::operator<<(poVar13,", pipeline validation status GL_FALSE expected GL_TRUE");
            std::__cxx11::stringbuf::str();
            tcu::TestLog::startShaderProgram
                      ((TestLog *)local_668,false,
                       (char *)progVF.m_shaders[0].
                               super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                               _M_impl.super__Vector_impl_data._M_start);
            std::__cxx11::string::~string((string *)&progVF);
            pbVar4 = local_668;
            tcu::TestLog::writeShader
                      ((TestLog *)local_668,QP_SHADER_TYPE_VERTEX,vtx._M_dataplus._M_p,true,
                       fixed_sample_locations_values + 1);
            tcu::TestLog::writeShader
                      ((TestLog *)pbVar4,QP_SHADER_TYPE_FRAGMENT,frag._M_dataplus._M_p,true,
                       fixed_sample_locations_values + 1);
            tcu::TestLog::endShaderProgram((TestLog *)pbVar4);
            pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar12,"InterfaceMatchingCase failed",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                       ,0xadd);
            __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          }
          _str = local_668;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_428);
          std::operator<<((ostream *)local_428,"Precision ");
          pcVar15 = "matches";
          if (iVar5 != 0) {
            pcVar15 = "mismatch";
          }
          std::operator<<((ostream *)local_428,pcVar15);
          std::operator<<((ostream *)local_428,", pipeline validation status GL_TRUE -> OK");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&str,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_428);
          (*gl->clear)(0x4000);
          GVar10 = (*gl->getAttribLocation)(program,"a_position");
          (*gl->vertexAttribPointer)(GVar10,4,0x1406,'\0',0,(void *)0x0);
          (*gl->enableVertexAttribArray)(GVar10);
          p_Var1 = gl->programUniform4f;
          GVar9 = (*gl->getUniformLocation)(program,"u_color");
          (*p_Var1)(program,GVar9,1.0,1.0,1.0,1.0);
          GVar7 = (*gl->getError)();
          glu::checkError(GVar7,"StateInteraction failure, set uniform value",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                          ,0xaeb);
          (*gl->drawElements)(4,6,0x1403,(void *)0x0);
          GVar7 = (*gl->getError)();
          glu::checkError(GVar7,"DrawElements failure",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                          ,0xaed);
          (*gl->disableVertexAttribArray)(GVar10);
          pRVar2 = ((this->super_TestCase).m_context)->m_renderCtx;
          tcu::Surface::getAccess((PixelBufferAccess *)&str,&renderedFrame);
          glu::readPixels(pRVar2,0,0,(PixelBufferAccess *)&str);
          tcu::Surface::Surface(&local_538,&renderedFrame);
          bVar17 = checkSurface(this,&local_538,(RGBA)0xffffffff);
          tcu::Surface::~Surface(&local_538);
          if (!bVar17) {
            pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar12,"InterfaceMatchingCase failed; surface should be white",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                       ,0xaf5);
            __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          }
        }
        else {
          if (value != 0) {
            tcu::TestLog::startShaderProgram
                      ((TestLog *)local_668,false,
                       "Precision mismatch, pipeline validation status GL_TRUE expected GL_FALSE");
            tcu::TestLog::writeShader
                      ((TestLog *)pbVar4,QP_SHADER_TYPE_VERTEX,vtx._M_dataplus._M_p,true,
                       fixed_sample_locations_values + 1);
            tcu::TestLog::writeShader
                      ((TestLog *)pbVar4,QP_SHADER_TYPE_FRAGMENT,frag._M_dataplus._M_p,true,
                       fixed_sample_locations_values + 1);
            tcu::TestLog::endShaderProgram((TestLog *)pbVar4);
            pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar12,"InterfaceMatchingCase failed",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                       ,0xac9);
            __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          }
          _str = local_668;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_428);
          std::operator<<((ostream *)local_428,
                          "Precision mismatch, Pipeline validation status GL_FALSE -> OK");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&str,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_428);
        }
        pRVar2 = ((this->super_TestCase).m_context)->m_renderCtx;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_590,vtx._M_dataplus._M_p,&local_659);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_570,frag._M_dataplus._M_p,&local_65a);
        glu::makeVtxFragSources((ProgramSources *)&str,&local_590,&local_570);
        glu::ShaderProgram::ShaderProgram(&progVF,pRVar2,(ProgramSources *)&str);
        glu::ProgramSources::~ProgramSources((ProgramSources *)&str);
        std::__cxx11::string::~string((string *)&local_570);
        std::__cxx11::string::~string((string *)&local_590);
        (*gl->useProgram)(progVF.m_program.m_program);
        p_Var3 = gl->uniform4f;
        GVar9 = (*gl->getUniformLocation)(progVF.m_program.m_program,"u_color");
        (*p_Var3)(GVar9,1.0,1.0,1.0,1.0);
        pbVar4 = local_668;
        if (progVF.m_program.m_info.linkOk == false) {
          glu::operator<<((TestLog *)local_668,&progVF);
          _str = pbVar4;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_428);
          std::operator<<((ostream *)local_428,
                          "Non separable program link status GL_FALSE expected GL_TRUE");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&str,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_428);
          pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar12,"InterfaceMatchingCase failed, non separable program should link",
                     (char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                     ,0xb06);
          __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        GVar10 = (*gl->getAttribLocation)(progVF.m_program.m_program,"a_position");
        (*gl->vertexAttribPointer)(GVar10,4,0x1406,'\0',0,(void *)0x0);
        (*gl->enableVertexAttribArray)(GVar10);
        (*gl->drawElements)(4,6,0x1403,(void *)0x0);
        (*gl->disableVertexAttribArray)(GVar10);
        GVar7 = (*gl->getError)();
        glu::checkError(GVar7,"StateInteraction failure, non separable program draw call",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                        ,0xb0f);
        pRVar2 = ((this->super_TestCase).m_context)->m_renderCtx;
        tcu::Surface::getAccess((PixelBufferAccess *)&str,&renderedFrame);
        glu::readPixels(pRVar2,0,0,(PixelBufferAccess *)&str);
        tcu::Surface::Surface(&local_550,&renderedFrame);
        bVar17 = checkSurface(this,&local_550,(RGBA)0xffffffff);
        tcu::Surface::~Surface(&local_550);
        if (!bVar17) {
          pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar12,
                     "InterfaceMatchingCase failed, non separable program, unexpected color found",
                     (char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                     ,0xb14);
          __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        (*gl->deleteProgram)(program);
        (*gl->deleteProgram)(local_660);
        (*gl->useProgram)(0);
        glu::ShaderProgram::~ShaderProgram(&progVF);
      }
      std::__cxx11::string::~string((string *)&fragmentPrecision);
      psVar16 = local_638 + 0x28;
    }
    std::__cxx11::string::~string((string *)&vertexPrecision);
    lVar11 = lVar11 + 1;
  } while( true );
}

Assistant:

IterateResult iterate(void)
	{
		TestLog&				 log		  = m_testCtx.getLog();
		const glw::Functions&	gl			  = m_context.getRenderContext().getFunctions();
		const tcu::RenderTarget& renderTarget = m_context.getRenderContext().getRenderTarget();
		int						 viewportW	= de::min(16, renderTarget.getWidth());
		int						 viewportH	= de::min(16, renderTarget.getHeight());
		tcu::Surface			 renderedFrame(viewportW, viewportH);

		glw::GLuint programA, programB;
		glw::GLuint vao, vertexBuf, indexBuf;
		std::string vtx;
		std::string frag, frag2;
		glw::GLuint pipeline;
		const char* srcStrings[1];
		glw::GLuint value;

		gl.viewport(0, 0, viewportW, viewportH);
		gl.clearColor(0.0f, 0.0f, 0.0f, 0.0f);
		gl.clear(GL_COLOR_BUFFER_BIT);

		static const deUint16 quadIndices[] = { 0, 1, 2, 2, 1, 3 };
		const float			  position[]	= { -1.0f, -1.0f, +1.0f, 1.0f, -1.0f, +1.0f, 0.0f,  1.0f,
								   +1.0f, -1.0f, 0.0f,  1.0f, +1.0f, +1.0f, -1.0f, 1.0f };

		/* Set up a vertex array object */
		gl.genVertexArrays(1, &vao);
		gl.bindVertexArray(vao);

		gl.genBuffers(1, &indexBuf);
		gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, indexBuf);
		gl.bufferData(GL_ELEMENT_ARRAY_BUFFER, sizeof(quadIndices), quadIndices, GL_STATIC_DRAW);

		gl.genBuffers(1, &vertexBuf);
		gl.bindBuffer(GL_ARRAY_BUFFER, vertexBuf);
		gl.bufferData(GL_ARRAY_BUFFER, sizeof(position), position, GL_STATIC_DRAW);

		/* Set up shader pipeline */
		gl.genProgramPipelines(1, &pipeline);
		gl.bindProgramPipeline(pipeline);

		struct PrecisionTests
		{
			TestType	testType;
			std::string precision;
		};

		PrecisionTests vertexPrecisionTests[] = {
			{ DEFAULT_PRECISION, "highp" },	{ SET_DEFAULT_PRECISION, "highp" }, { SET_DEFAULT_PRECISION, "mediump" },
			{ SET_DEFAULT_PRECISION, "lowp" }, { SET_PRECISION, "highp" },		   { SET_PRECISION, "mediump" },
			{ SET_PRECISION, "lowp" }
		};

		PrecisionTests fragmentPrecisionTests[] = { { DEFAULT_PRECISION, getDefaultFragmentPrecision() },
													{ SET_DEFAULT_PRECISION, "highp" },
													{ SET_DEFAULT_PRECISION, "mediump" },
													{ SET_DEFAULT_PRECISION, "lowp" },
													{ SET_PRECISION, "highp" },
													{ SET_PRECISION, "mediump" },
													{ SET_PRECISION, "lowp" } };

		// Shader interface matching inputs/outputs precision
		int maxTests = 7;
		for (int vertexTestIteration = 0; vertexTestIteration < maxTests; vertexTestIteration++)
		{
			std::string vertexPrecision = vertexPrecisionTests[vertexTestIteration].precision;
			TestType	vertexTestType  = vertexPrecisionTests[vertexTestIteration].testType;
			for (int fragmentTestIteration = 0; fragmentTestIteration < maxTests; fragmentTestIteration++)
			{
				std::string fragmentPrecision = fragmentPrecisionTests[fragmentTestIteration].precision;
				TestType	fragmentTestType  = fragmentPrecisionTests[fragmentTestIteration].testType;
				if (fragmentPrecision.empty())
					continue;

				log << TestLog::Message << "vertex shader precision: " << vertexPrecision
					<< ", shader test mode: " << getTestTypeName(vertexTestType) << TestLog::EndMessage;

				log << TestLog::Message << "fragment shader precision: " << fragmentPrecision
					<< ", shader test mode: " << getTestTypeName(fragmentTestType) << TestLog::EndMessage;

				generateVarLinkVertexShaderSrc(vtx, m_glslVersion, vertexPrecision, vertexTestType);
				generateVarLinkFragmentShaderSrc(frag, m_glslVersion, fragmentPrecision, fragmentTestType);

				srcStrings[0] = vtx.c_str();
				programA	  = gl.createShaderProgramv(GL_VERTEX_SHADER, 1, srcStrings);
				if (!checkCSProg(gl, programA))
				{
					TCU_FAIL("CreateShaderProgramv failed for vertex shader");
				}
				srcStrings[0] = frag.c_str();
				programB	  = gl.createShaderProgramv(GL_FRAGMENT_SHADER, 1, srcStrings);
				if (!checkCSProg(gl, programB))
				{
					TCU_FAIL("CreateShaderProgramv failed for fragment shader");
				}

				gl.useProgramStages(pipeline, GL_VERTEX_SHADER_BIT, programA);
				gl.useProgramStages(pipeline, GL_FRAGMENT_SHADER_BIT, programB);
				GLU_EXPECT_NO_ERROR(gl.getError(), "InterfaceMatching failure");

				// Mismatched input and output qualifiers
				// For OpenGL ES contexts, this should result in a validation failure.
				// For OpenGL contexts, validation should succeed.
				gl.validateProgramPipeline(pipeline);
				gl.getProgramPipelineiv(pipeline, GL_VALIDATE_STATUS, (glw::GLint*)&value);
				int precisionCompareResult = fragmentPrecision.compare(vertexPrecision);
				if (glu::isContextTypeES(m_context.getRenderContext().getType()) && (precisionCompareResult != 0))
				{
					// precision mismatch
					if (value != GL_FALSE)
					{
						log.startShaderProgram(
							false, "Precision mismatch, pipeline validation status GL_TRUE expected GL_FALSE");
						log.writeShader(QP_SHADER_TYPE_VERTEX, vtx.c_str(), true, "");
						log.writeShader(QP_SHADER_TYPE_FRAGMENT, frag.c_str(), true, "");
						log.endShaderProgram();
						TCU_FAIL("InterfaceMatchingCase failed");
					}
					else
					{
						log << TestLog::Message << "Precision mismatch, Pipeline validation status GL_FALSE -> OK"
							<< TestLog::EndMessage;
					}
				}
				else
				{
					if (value != GL_TRUE)
					{
						std::stringstream str;
						str << "Precision " << (precisionCompareResult ? "mismatch" : "matches")
							<< ", pipeline validation status GL_FALSE expected GL_TRUE";

						log.startShaderProgram(false, str.str().c_str());
						log.writeShader(QP_SHADER_TYPE_VERTEX, vtx.c_str(), true, "");
						log.writeShader(QP_SHADER_TYPE_FRAGMENT, frag.c_str(), true, "");
						log.endShaderProgram();
						TCU_FAIL("InterfaceMatchingCase failed");
					}
					else
					{
						log << TestLog::Message << "Precision " << (precisionCompareResult ? "mismatch" : "matches")
							<< ", pipeline validation status GL_TRUE -> OK" << TestLog::EndMessage;
						// precision matches
						gl.clear(GL_COLOR_BUFFER_BIT);
						// white
						int posLoc = gl.getAttribLocation(programA, "a_position");
						gl.vertexAttribPointer(posLoc, 4, GL_FLOAT, GL_FALSE, 0, 0);
						gl.enableVertexAttribArray(posLoc);
						gl.programUniform4f(programA, gl.getUniformLocation(programA, "u_color"), 1.0f, 1.0f, 1.0f,
											1.0f);
						GLU_EXPECT_NO_ERROR(gl.getError(), "StateInteraction failure, set uniform value");
						gl.drawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(quadIndices), GL_UNSIGNED_SHORT, NULL);
						GLU_EXPECT_NO_ERROR(gl.getError(), "DrawElements failure");
						gl.disableVertexAttribArray(posLoc);

						glu::readPixels(m_context.getRenderContext(), 0, 0, renderedFrame.getAccess());

						// expect white
						if (!checkSurface(renderedFrame, tcu::RGBA::white()))
						{
							TCU_FAIL("InterfaceMatchingCase failed; surface should be white");
						}
					}
				}

				// validate non separable program

				glu::ShaderProgram progVF(m_context.getRenderContext(),
										  glu::makeVtxFragSources(vtx.c_str(), frag.c_str()));

				gl.useProgram(progVF.getProgram());
				gl.uniform4f(gl.getUniformLocation(progVF.getProgram(), "u_color"), 1.0f, 1.0f, 1.0f, 1.0f);
				if (!progVF.getProgramInfo().linkOk)
				{
					log << progVF;
					log << TestLog::Message << "Non separable program link status GL_FALSE expected GL_TRUE"
						<< TestLog::EndMessage;
					TCU_FAIL("InterfaceMatchingCase failed, non separable program should link");
				}

				int posLoc = gl.getAttribLocation(progVF.getProgram(), "a_position");
				gl.vertexAttribPointer(posLoc, 4, GL_FLOAT, GL_FALSE, 0, 0);
				gl.enableVertexAttribArray(posLoc);
				gl.drawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(quadIndices), GL_UNSIGNED_SHORT, NULL);
				gl.disableVertexAttribArray(posLoc);

				GLU_EXPECT_NO_ERROR(gl.getError(), "StateInteraction failure, non separable program draw call");
				glu::readPixels(m_context.getRenderContext(), 0, 0, renderedFrame.getAccess());
				// expect white
				if (!checkSurface(renderedFrame, tcu::RGBA::white()))
				{
					TCU_FAIL("InterfaceMatchingCase failed, non separable program, unexpected color found");
				}

				gl.deleteProgram(programA);
				gl.deleteProgram(programB);
				gl.useProgram(0);
			}
		}
		gl.bindVertexArray(0);
		gl.deleteVertexArrays(1, &vao);
		gl.deleteBuffers(1, &indexBuf);
		gl.deleteBuffers(1, &vertexBuf);
		gl.bindProgramPipeline(0);
		gl.deleteProgramPipelines(1, &pipeline);

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}